

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O0

int write_sparse_fill_chunk(output_file *out,uint len,uint32_t fill_val)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  int in_ESI;
  long *in_RDI;
  int ret;
  int count;
  int rnd_up_len;
  chunk_header_t chunk_header;
  uint local_2c;
  undefined2 local_24;
  undefined2 local_22;
  uint local_20;
  undefined4 local_1c;
  undefined1 local_18 [8];
  long *local_10;
  int local_4;
  
  uVar1 = *(int *)((long)in_RDI + 0x24) *
          (((in_ESI + *(int *)((long)in_RDI + 0x24)) - 1U) / *(uint *)((long)in_RDI + 0x24));
  local_24 = 0xcac2;
  local_22 = 0;
  local_20 = uVar1 / *(uint *)((long)in_RDI + 0x24);
  local_1c = 0x10;
  local_10 = in_RDI;
  iVar2 = (**(code **)(in_RDI[2] + 0x18))(in_RDI,&local_24,0xc);
  if (iVar2 < 0) {
    local_4 = -1;
  }
  else {
    iVar2 = (**(code **)(local_10[2] + 0x18))(local_10,local_18,4);
    if (iVar2 < 0) {
      local_4 = -1;
    }
    else {
      if ((int)local_10[4] != 0) {
        local_2c = *(uint *)((long)local_10 + 0x24) >> 2;
        while (local_2c != 0) {
          uVar3 = sparse_crc32(*(uint32_t *)((long)local_10 + 0xc),local_18,4);
          *(uint32_t *)((long)local_10 + 0xc) = uVar3;
          local_2c = local_2c - 1;
        }
      }
      *local_10 = (long)(int)uVar1 + *local_10;
      *(int *)(local_10 + 1) = (int)local_10[1] + 1;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int write_sparse_fill_chunk(struct output_file* out, unsigned int len, uint32_t fill_val) {
  chunk_header_t chunk_header;
  int rnd_up_len, count;
  int ret;

  /* Round up the fill length to a multiple of the block size */
  rnd_up_len = ALIGN(len, out->block_size);

  /* Finally we can safely emit a chunk of data */
  chunk_header.chunk_type = CHUNK_TYPE_FILL;
  chunk_header.reserved1 = 0;
  chunk_header.chunk_sz = rnd_up_len / out->block_size;
  chunk_header.total_sz = CHUNK_HEADER_LEN + sizeof(fill_val);
  ret = out->ops->write(out, &chunk_header, sizeof(chunk_header));

  if (ret < 0) return -1;
  ret = out->ops->write(out, &fill_val, sizeof(fill_val));
  if (ret < 0) return -1;

  if (out->use_crc) {
    count = out->block_size / sizeof(uint32_t);
    while (count--) out->crc32 = sparse_crc32(out->crc32, &fill_val, sizeof(uint32_t));
  }

  out->cur_out_ptr += rnd_up_len;
  out->chunk_cnt++;

  return 0;
}